

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O1

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  int iVar1;
  CallInfo *pCVar2;
  ulong uVar3;
  
  pCVar2 = L->ci;
  if (0 < level) {
    do {
      if (pCVar2 <= L->base_ci) break;
      level = level + -1;
      if ((((pCVar2->func->value).gc)->h).flags == '\0') {
        level = level - pCVar2->tailcalls;
      }
      pCVar2 = pCVar2 + -1;
    } while (0 < level);
  }
  if ((level == 0) && (uVar3 = (long)pCVar2 - (long)L->base_ci, L->base_ci <= pCVar2 && uVar3 != 0))
  {
    iVar1 = (int)(uVar3 >> 3) * -0x33333333;
  }
  else {
    iVar1 = 0;
    if (-1 < level) {
      return 0;
    }
  }
  ar->i_ci = iVar1;
  return 1;
}

Assistant:

LUA_API int lua_getstack (lua_State *L, int level, lua_Debug *ar) {
  int status;
  CallInfo *ci;
  lua_lock(L);
  for (ci = L->ci; level > 0 && ci > L->base_ci; ci--) {
    level--;
    if (f_isLua(ci))  /* Lua function? */
      level -= ci->tailcalls;  /* skip lost tail calls */
  }
  if (level == 0 && ci > L->base_ci) {  /* level found? */
    status = 1;
    ar->i_ci = cast_int(ci - L->base_ci);
  }
  else if (level < 0) {  /* level is of a lost tail call? */
    status = 1;
    ar->i_ci = 0;
  }
  else status = 0;  /* no such level */
  lua_unlock(L);
  return status;
}